

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall CMU462::Camera::compute_position(Camera *this)

{
  double dVar1;
  int iVar2;
  Vector3D *pVVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Vector3D local_a8;
  undefined1 local_90 [8];
  Vector3D screenYDir;
  Vector3D screenXDir;
  Vector3D upVec;
  double local_40;
  double local_38;
  undefined1 local_30 [8];
  Vector3D dirToCamera;
  double sinPhi;
  Camera *this_local;
  
  dirToCamera.z = sin(this->phi);
  if ((dirToCamera.z == 0.0) && (!NAN(dirToCamera.z))) {
    this->phi = this->phi + 9.999999747378752e-06;
    dirToCamera.z = sin(this->phi);
  }
  dVar4 = this->r * dirToCamera.z;
  dVar5 = sin(this->theta);
  dVar1 = this->r;
  dVar6 = cos(this->phi);
  dVar7 = this->r * dirToCamera.z;
  dVar8 = cos(this->theta);
  Vector3D::Vector3D((Vector3D *)local_30,dVar4 * dVar5,dVar1 * dVar6,dVar7 * dVar8);
  Vector3D::operator+((Vector3D *)&upVec.z,&this->targetPos,(Vector3D *)local_30);
  (this->pos).x = upVec.z;
  (this->pos).y = local_40;
  (this->pos).z = local_38;
  iVar2 = -1;
  if (0.0 < dirToCamera.z) {
    iVar2 = 1;
  }
  Vector3D::Vector3D((Vector3D *)&screenXDir.z,0.0,(double)iVar2,0.0);
  cross((Vector3D *)&screenYDir.z,(Vector3D *)&screenXDir.z,(Vector3D *)local_30);
  Vector3D::normalize((Vector3D *)&screenYDir.z);
  cross((Vector3D *)local_90,(Vector3D *)local_30,(Vector3D *)&screenYDir.z);
  Vector3D::normalize((Vector3D *)local_90);
  pVVar3 = Matrix3x3::operator[](&this->c2w,0);
  pVVar3->x = screenYDir.z;
  pVVar3->y = screenXDir.x;
  pVVar3->z = screenXDir.y;
  pVVar3 = Matrix3x3::operator[](&this->c2w,1);
  pVVar3->x = (double)local_90;
  pVVar3->y = screenYDir.x;
  pVVar3->z = screenYDir.y;
  Vector3D::unit(&local_a8,(Vector3D *)local_30);
  pVVar3 = Matrix3x3::operator[](&this->c2w,2);
  pVVar3->x = local_a8.x;
  pVVar3->y = local_a8.y;
  pVVar3->z = local_a8.z;
  return;
}

Assistant:

void Camera::compute_position() {
    double sinPhi = sin(phi);
    if (sinPhi == 0) {
      phi += EPS_F;
      sinPhi = sin(phi);
    }
    const Vector3D dirToCamera(r * sinPhi * sin(theta),
        r * cos(phi),
        r * sinPhi * cos(theta));
    pos = targetPos + dirToCamera;
    Vector3D upVec(0, sinPhi > 0 ? 1 : -1, 0);
    Vector3D screenXDir = cross(upVec, dirToCamera);
    screenXDir.normalize();
    Vector3D screenYDir = cross(dirToCamera, screenXDir);
    screenYDir.normalize();

    c2w[0] = screenXDir;
    c2w[1] = screenYDir;
    c2w[2] = dirToCamera.unit();   // camera's view direction is the
    // opposite of of dirToCamera, so
    // directly using dirToCamera as
    // column 2 of the matrix takes [0 0 -1]
    // to the world space view direction
  }